

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex.h
# Opt level: O2

bool __thiscall
Gudhi::cubical_complex::
is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
::operator()(is_before_in_filtration<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
             *this,Simplex_handle *sh1,Simplex_handle *sh2)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  
  pdVar3 = (this->CC_->super_Bitmap_cubical_complex_periodic_boundary_conditions_base<double>).
           super_Bitmap_cubical_complex_base<double>.data.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  dVar1 = pdVar3[*sh1];
  dVar2 = pdVar3[*sh2];
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    bVar4 = dVar1 < dVar2;
  }
  else {
    uVar5 = Bitmap_cubical_complex_base<double>::get_dimension_of_a_cell
                      ((Bitmap_cubical_complex_base<double> *)this->CC_,*sh1);
    uVar6 = Bitmap_cubical_complex_base<double>::get_dimension_of_a_cell
                      ((Bitmap_cubical_complex_base<double> *)this->CC_,*sh2);
    bVar4 = *sh1 < *sh2;
    if (uVar5 != uVar6) {
      bVar4 = uVar5 < uVar6;
    }
  }
  return bVar4;
}

Assistant:

bool operator()(const typename Bitmap_cubical_complex<T>::Simplex_handle& sh1,
                  const typename Bitmap_cubical_complex<T>::Simplex_handle& sh2) const {
    // Not using st_->filtration(sh1) because it uselessly tests for null_simplex.
    typedef typename T::filtration_type Filtration_value;
    Filtration_value fil1 = CC_->data[sh1];
    Filtration_value fil2 = CC_->data[sh2];
    if (fil1 != fil2) {
      return fil1 < fil2;
    }
    // in this case they are on the same filtration level, so the dimension decide.
    std::size_t dim1 = CC_->get_dimension_of_a_cell(sh1);
    std::size_t dim2 = CC_->get_dimension_of_a_cell(sh2);
    if (dim1 != dim2) {
      return dim1 < dim2;
    }
    // in this case both filtration and dimensions of the considered cubes are the same. To have stable sort, we simply
    // compare their positions in the bitmap:
    return sh1 < sh2;
  }